

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::vector<int,_std::allocator<int>_>_&> * __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (ElementsAreMatcher<std::tuple<int,_int,_int,_int>_> *this)

{
  back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
  bVar1;
  iterator first;
  iterator last;
  size_type in_RSI;
  Matcher<const_std::vector<int,_std::allocator<int>_>_&> *in_RDI;
  MatcherVec matchers;
  vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  *in_stack_ffffffffffffff58;
  ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *this_00;
  ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *this_01;
  ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> local_28;
  
  this_01 = &local_28;
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  vector((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_> *)
         0x9bc053);
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  reserve((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_> *)
          this_01,in_RSI);
  bVar1 = std::
          back_inserter<std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>>
                    (in_stack_ffffffffffffff58);
  bVar1 = TransformTupleValues<std::tuple<int,int,int,int>,testing::internal::CastAndAppendTransform<int_const&>,std::back_insert_iterator<std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>>>
                    (in_RSI,bVar1.container);
  operator_new(0x20);
  this_00 = &local_28;
  first = std::
          vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
          begin(in_stack_ffffffffffffff58);
  last = std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
         ::end(in_stack_ffffffffffffff58);
  ElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<int_const&>*,std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>>>
            (this_01,(__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
                      )first._M_current,
             (__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
              )last._M_current);
  Matcher<const_std::vector<int,_std::allocator<int>_>_&>::Matcher
            ((Matcher<const_std::vector<int,_std::allocator<int>_>_&> *)this_00,
             (MatcherInterface<const_std::vector<int,_std::allocator<int>_>_&> *)
             in_stack_ffffffffffffff58);
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  ~vector(bVar1.container);
  return in_RDI;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        "use UnorderedElementsAre with hash tables");

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }